

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O0

anon_enum_32
SCoro::
Poll<SCoro::SCoro<PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>,5ul,Delay<100u>::type,PrintStart>>::PrintPlus,PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>,5ul,Delay<100u>::type,PrintStart>>::PrintNewline>>
          (SCoro<PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>::PrintPlus,_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>::PrintNewline>
           *obj)

{
  Result RVar1;
  common_fn_t p_Var2;
  size_t sVar3;
  SCoro<PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>::PrintPlus,_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>::PrintNewline>
  *obj_local;
  
  p_Var2 = Impl::
           get<SCoro::SCoro<PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>,5ul,Delay<100u>::type,PrintStart>>::PrintPlus,PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>,5ul,Delay<100u>::type,PrintStart>>::PrintNewline>>
                     (obj);
  RVar1 = (*p_Var2)(obj);
  if (RVar1.value == Yield) {
    obj_local._4_4_ = Yield;
  }
  else if (RVar1.value == Next) {
    sVar3 = EboIndex<2UL>::Next(&obj->super_EboIndex<2UL>);
    obj_local._4_4_ = End;
    if (sVar3 < 2) {
      obj_local._4_4_ = Next;
    }
  }
  else {
    obj_local._4_4_ = End;
  }
  return obj_local._4_4_;
}

Assistant:

constexpr auto Poll(Obj & obj) noexcept
    {
        switch (Impl::get(obj)(obj).value)
        {
        case Result::Next:
            return obj.Next() < obj.count ? Result::Next : Result::End;
        case Result::Yield:
            return Result::Yield;    
        default:
            return Result::End;
        }
    }